

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_test.cpp
# Opt level: O0

void __thiscall biosoup::test::BiosoupTimerTest_Lap_Test::TestBody(BiosoupTimerTest_Lap_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  double dVar3;
  string local_190;
  AssertHelper local_170;
  Message local_168;
  bool local_159;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_128;
  Message local_120;
  bool local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar__2;
  Message local_f8;
  double local_f0;
  int local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_b0;
  Message local_a8;
  bool local_99;
  undefined1 local_98 [8];
  AssertionResult gtest_ar__1;
  duration<long,std::ratio<1l,1000l>> local_80 [8];
  string local_78;
  AssertHelper local_58;
  Message local_50 [3];
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  Timer t;
  BiosoupTimerTest_Lap_Test *this_local;
  
  this_00 = &gtest_ar_.message_;
  Timer::Timer((Timer *)this_00);
  Timer::Start((Timer *)this_00);
  dVar3 = Timer::Lap((Timer *)this_00);
  local_31 = ExpectWithinInclusive(0.0,0.001,dVar3);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_30,&local_31,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)local_30,
               (AssertionResult *)"ExpectWithinInclusive(0, 0.001, t.Lap())","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/timer_test.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0x100;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            (local_80,(int *)((long)&gtest_ar__1.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             + 4));
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)local_80);
  dVar3 = Timer::Lap((Timer *)&gtest_ar_.message_);
  local_99 = ExpectWithinInclusive(0.256,0.384,dVar3);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_98,&local_99,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_98,
               (AssertionResult *)"ExpectWithinInclusive(0.256, 0.384, t.Lap())","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/timer_test.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_e4 = 0;
  local_f0 = Timer::elapsed_time((Timer *)&gtest_ar_.message_);
  testing::internal::EqHelper::Compare<int,_double,_nullptr>
            ((EqHelper *)local_e0,"0","t.elapsed_time()",&local_e4,&local_f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/timer_test.cpp"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  dVar3 = Timer::Stop((Timer *)&gtest_ar_.message_);
  local_111 = ExpectWithinInclusive(0.256,0.384,dVar3);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_110,&local_111,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_110,
               (AssertionResult *)"ExpectWithinInclusive(0.256, 0.384, t.Stop())","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/timer_test.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  dVar3 = Timer::Lap((Timer *)&gtest_ar_.message_);
  local_159 = ExpectWithinInclusive(0.0,0.001,dVar3);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_158,&local_159,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_190,(internal *)local_158,
               (AssertionResult *)"ExpectWithinInclusive(0, 0.001, t.Lap())","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/timer_test.cpp"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  return;
}

Assistant:

TEST(BiosoupTimerTest, Lap) {
  Timer t{};
  t.Start();
  EXPECT_TRUE(ExpectWithinInclusive(0, 0.001, t.Lap()));
  std::this_thread::sleep_for(std::chrono::milliseconds(256));
  EXPECT_TRUE(ExpectWithinInclusive(0.256, 0.384, t.Lap()));
  EXPECT_EQ(0, t.elapsed_time());
  EXPECT_TRUE(ExpectWithinInclusive(0.256, 0.384, t.Stop()));
  EXPECT_TRUE(ExpectWithinInclusive(0, 0.001, t.Lap()));
}